

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemv.hpp
# Opt level: O0

void remora::bindings::
     gemv_impl<remora::vector<double,remora::cpu_tag>,remora::dense_matrix_adaptor<double_const,remora::column_major,remora::dense_tag,remora::cpu_tag>,remora::dense_vector_adaptor<double_const,remora::continuous_dense_tag,remora::cpu_tag>>
               (random_access_iterator_base<remora::iterators::dense_storage_iterator<const_double,_remora::iterators::dense_random_access_iterator_tag>,_double,_remora::iterators::dense_random_access_iterator_tag>
                *param_1,undefined8 param_2,
               vector_expression<remora::dense_vector_adaptor<const_double,_remora::continuous_dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
               *param_3,vector_expression<remora::dense_vector_adaptor<const_double,_remora::dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
                        *param_4)

{
  bool bVar1;
  reference pdVar2;
  int __c;
  char *__s;
  iterator it;
  iterator end;
  dense_vector_adaptor<const_double,_remora::continuous_dense_tag,_remora::cpu_tag>
  *in_stack_ffffffffffffff70;
  random_access_iterator_base<remora::iterators::dense_storage_iterator<const_double,_remora::iterators::dense_random_access_iterator_tag>,_double,_remora::iterators::dense_random_access_iterator_tag>
  *in_stack_ffffffffffffff78;
  vector_expression<remora::dense_vector_adaptor<const_double,_remora::dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
  *in_stack_ffffffffffffff80;
  multiply_and_add<double> in_stack_ffffffffffffff88;
  multiply_and_add<double> in_stack_ffffffffffffff90;
  size_type in_stack_ffffffffffffff98;
  matrix_expression<remora::dense_matrix_adaptor<const_double,_remora::column_major,_remora::dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
  *in_stack_ffffffffffffffa0;
  dense_storage_iterator<const_double,_remora::iterators::dense_random_access_iterator_tag> local_58
  ;
  char local_40 [24];
  random_access_iterator_base<remora::iterators::dense_storage_iterator<const_double,_remora::iterators::dense_random_access_iterator_tag>,_double,_remora::iterators::dense_random_access_iterator_tag>
  *local_28;
  vector_expression<remora::dense_vector_adaptor<const_double,_remora::dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
  *local_20;
  vector_expression<remora::dense_vector_adaptor<const_double,_remora::continuous_dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
  *local_18;
  undefined8 local_10;
  
  local_28 = param_1;
  local_20 = param_4;
  local_18 = param_3;
  local_10 = param_2;
  vector_expression<remora::dense_vector_adaptor<const_double,_remora::continuous_dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
  ::operator()(param_3);
  dense_vector_adaptor<const_double,_remora::continuous_dense_tag,_remora::cpu_tag>::end
            ((dense_vector_adaptor<const_double,_remora::continuous_dense_tag,_remora::cpu_tag> *)
             in_stack_ffffffffffffff90.scalar);
  vector_expression<remora::dense_vector_adaptor<const_double,_remora::continuous_dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
  ::operator()(local_18);
  dense_vector_adaptor<const_double,_remora::continuous_dense_tag,_remora::cpu_tag>::begin
            (in_stack_ffffffffffffff70);
  while( true ) {
    __s = local_40;
    bVar1 = iterators::operator!=
                      ((random_access_iterator_base<remora::iterators::dense_storage_iterator<const_double,_remora::iterators::dense_random_access_iterator_tag>,_double,_remora::iterators::dense_random_access_iterator_tag>
                        *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    if (!bVar1) break;
    in_stack_ffffffffffffff80 = local_20;
    iterators::
    dense_storage_iterator<const_double,_remora::iterators::dense_random_access_iterator_tag>::index
              (&local_58,__s,__c);
    column<remora::dense_matrix_adaptor<double_const,remora::column_major,remora::dense_tag,remora::cpu_tag>,remora::cpu_tag>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    in_stack_ffffffffffffff78 = local_28;
    pdVar2 = iterators::
             dense_storage_iterator<const_double,_remora::iterators::dense_random_access_iterator_tag>
             ::operator*(&local_58);
    device_traits<remora::cpu_tag>::multiply_and_add<double>::multiply_and_add
              ((multiply_and_add<double> *)&stack0xffffffffffffff88,
               (double)in_stack_ffffffffffffff78 * *pdVar2);
    kernels::
    assign<remora::device_traits<remora::cpu_tag>::multiply_and_add<double>,remora::vector<double,remora::cpu_tag>,remora::dense_vector_adaptor<double_const,remora::dense_tag,remora::cpu_tag>,remora::cpu_tag>
              ((vector_expression<remora::vector<double,_remora::cpu_tag>,_remora::cpu_tag> *)
               in_stack_ffffffffffffff88.scalar,in_stack_ffffffffffffff80,in_stack_ffffffffffffff90)
    ;
    iterators::
    dense_storage_iterator<const_double,_remora::iterators::dense_random_access_iterator_tag>::
    operator++(&local_58);
  }
  return;
}

Assistant:

void gemv_impl(
	matrix_expression<MatA, cpu_tag> const& A,
	vector_expression<V, cpu_tag> const& x,
	vector_expression<ResultV, cpu_tag>& result,
	typename ResultV::value_type alpha,
	column_major
) {
	typedef typename V::const_iterator iterator;
	typedef typename ResultV::value_type value_type;
	typedef device_traits<cpu_tag>::multiply_and_add<value_type> MultAdd;
	iterator end = x().end();
	for(iterator it = x().begin(); it != end; ++it) {
		//FIXME: for sparse result vectors, this might hurt.
		kernels::assign(result, column(A,it.index()), MultAdd(alpha * (*it)));
	}
}